

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDI;
  char *unaff_retaddr;
  ImGuiTextRange *f;
  int i;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_stack_ffffffffffffffd0;
  int local_24;
  char *needle_end;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  needle_end = in_RDI;
  bVar1 = ImVector<ImGuiTextFilter::ImGuiTextRange>::empty
                    ((ImVector<ImGuiTextFilter::ImGuiTextRange> *)(in_RDI + 0x100));
  if (bVar1) {
    bVar1 = true;
  }
  else {
    for (local_24 = 0; local_24 != *(int *)(in_RDI + 0x100); local_24 = local_24 + 1) {
      in_stack_ffffffffffffffd0 =
           (ImVector<ImGuiTextFilter::ImGuiTextRange> *)
           ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[]
                     (in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
      bVar1 = ImGuiTextRange::empty((ImGuiTextRange *)in_stack_ffffffffffffffd0);
      if (!bVar1) {
        if (**(char **)in_stack_ffffffffffffffd0 == '-') {
          pcVar2 = ImStristr((char *)f,unaff_retaddr,
                             (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             needle_end);
          if (pcVar2 != (char *)0x0) {
            return false;
          }
        }
        else {
          pcVar2 = ImStristr((char *)f,unaff_retaddr,
                             (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             needle_end);
          if (pcVar2 != (char *)0x0) {
            return true;
          }
        }
      }
    }
    if (*(int *)(in_RDI + 0x110) == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const ImGuiTextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.b[0] == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.b + 1, f.e) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.b, f.e) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}